

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

double __thiscall
CEPlanet::MeanAnomaly(CEPlanet *this,double mean_longitude_deg,double perihelion_long_deg,double T)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double M;
  undefined8 local_28;
  
  dVar1 = *(double *)(in_RDI + 0x120);
  dVar2 = *(double *)(in_RDI + 0x128);
  dVar4 = cos(*(double *)(in_RDI + 0x138) * in_XMM2_Qa * 0.017453292519943295);
  dVar3 = *(double *)(in_RDI + 0x130);
  dVar5 = sin(*(double *)(in_RDI + 0x138) * in_XMM2_Qa * 0.017453292519943295);
  for (local_28 = dVar3 * dVar5 +
                  dVar2 * dVar4 + dVar1 * in_XMM2_Qa * in_XMM2_Qa + (in_XMM0_Qa - in_XMM1_Qa);
      180.0 < local_28; local_28 = local_28 - 360.0) {
  }
  for (; local_28 < -180.0; local_28 = local_28 + 360.0) {
  }
  return local_28;
}

Assistant:

double CEPlanet::MeanAnomaly(double mean_longitude_deg,
                             double perihelion_long_deg,
                             double T) const
{
    double M = mean_longitude_deg - perihelion_long_deg + (b_*T*T)
                + c_*std::cos(f_*T*DD2R) + s_*std::sin(f_*T*DD2R) ;
    // Scale M to be in the range (-180,180)
    while (M>180.0) M-=360.0 ;
    while (M<-180.0) M+=360.0 ;
    
    return M ;
}